

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O2

string * str_replPers(string *s)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_,
                 "\\b[A-Z0-9._%+-]+@[A-Z0-9.-]+\\.[A-Z]{2,}\\b",1);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_);
    }
  }
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&local_30,s,&str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_,"[email@ano.nym]",
             0);
  std::__cxx11::string::operator=((string *)s,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_,"\\/home\\/[-_\\.a-z]+\\/",
                 1);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_);
    }
  }
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&local_30,s,&str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_,"/home/[user]/",0);
  std::__cxx11::string::operator=((string *)s,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_,
                 "[\\/\\\\]Users[\\/\\\\][-_\\.a-z]+[\\/\\\\]",1);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_);
    }
  }
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&local_30,s,&str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_,"/Users/[user]/",0
            );
  std::__cxx11::string::operator=((string *)s,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return s;
}

Assistant:

std::string& str_replPers (std::string& s)
{
    // replace email addresses
    static std::regex reEMail("\\b[A-Z0-9._%+-]+@[A-Z0-9.-]+\\.[A-Z]{2,}\\b", std::regex::icase);
    s = std::regex_replace(s, reEMail, "[email@ano.nym]");
    
    // Replace user's directory name in Linux
    static std::regex reHome("\\/home\\/[-_\\.a-z]+\\/", std::regex::icase);
    s = std::regex_replace(s, reHome, "/home/[user]/");

    // Replace user's directory name in MacOS or Windows
    static std::regex reUsers("[\\/\\\\]Users[\\/\\\\][-_\\.a-z]+[\\/\\\\]", std::regex::icase);
    s = std::regex_replace(s, reUsers, "/Users/[user]/");

    return s;
}